

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O0

void dlib::blas_bindings::
     matrix_assign_blas<float,dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
               *src)

{
  bool bVar1;
  matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
  *src_00;
  matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *in_RSI;
  assignable_ptr_matrix<float> *in_RDI;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
  *in_stack_ffffffffffffff88;
  assignable_ptr_matrix<float> *in_stack_ffffffffffffff90;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *dest_00;
  matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
  *in_stack_ffffffffffffffa0;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_stack_ffffffffffffffa8;
  assignable_ptr_matrix<float> *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  long in_stack_ffffffffffffffc0;
  other in_stack_ffffffffffffffc8;
  
  mat<float>((float *)in_stack_ffffffffffffffc8._vptr_memory_manager_stateless_kernel_1,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
          ::aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                    (in_stack_ffffffffffffffa0,in_RSI);
  if (bVar1) {
    src_00 = (matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
              *)assignable_ptr_matrix<float>::nr(in_RDI);
    assignable_ptr_matrix<float>::nc(in_RDI);
    dest_00 = (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)&stack0xffffffffffffffb0;
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    matrix((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
            *)in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,
           (long)in_stack_ffffffffffffffa0);
    matrix_assign_blas_proxy<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
              (dest_00,src_00,0.0,false,true);
    matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    ~matrix((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
             *)0x286dda);
  }
  else {
    matrix_assign_blas_proxy<dlib::assignable_ptr_matrix<float>,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0.0,false,true);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            assignable_ptr_matrix<T>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(mat(dest.ptr,dest.height,dest.width)))
            {
                matrix<T> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                matrix_assign_default(dest,temp);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }